

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this)

{
  string local_50 [32];
  string local_30 [32];
  Board *local_10;
  Board *this_local;
  
  local_10 = this;
  memcpy(this,&DAT_0011b4ac,0x90);
  std::__cxx11::string::string((string *)&this->identifier);
  std::__cxx11::string::string((string *)&this->referrer);
  std::vector<Block,_std::allocator<Block>_>::vector(&this->blocks);
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator=((string *)&this->identifier,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::operator=((string *)&this->referrer,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Board::Board() {
    this->identifier = string();
    this->referrer = string();
}